

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.hpp
# Opt level: O0

bool __thiscall spirv_cross::MSLConstexprSampler::swizzle_has_one_or_zero(MSLConstexprSampler *this)

{
  bool local_11;
  MSLConstexprSampler *this_local;
  
  local_11 = true;
  if ((((this->swizzle[0] != MSL_COMPONENT_SWIZZLE_ZERO) &&
       (local_11 = true, this->swizzle[0] != MSL_COMPONENT_SWIZZLE_ONE)) &&
      (local_11 = true, this->swizzle[1] != MSL_COMPONENT_SWIZZLE_ZERO)) &&
     (((local_11 = true, this->swizzle[1] != MSL_COMPONENT_SWIZZLE_ONE &&
       (local_11 = true, this->swizzle[2] != MSL_COMPONENT_SWIZZLE_ZERO)) &&
      ((local_11 = true, this->swizzle[2] != MSL_COMPONENT_SWIZZLE_ONE &&
       (local_11 = true, this->swizzle[3] != MSL_COMPONENT_SWIZZLE_ZERO)))))) {
    local_11 = this->swizzle[3] == MSL_COMPONENT_SWIZZLE_ONE;
  }
  return local_11;
}

Assistant:

bool swizzle_has_one_or_zero() const
	{
		return (swizzle[0] == MSL_COMPONENT_SWIZZLE_ZERO || swizzle[0] == MSL_COMPONENT_SWIZZLE_ONE ||
		        swizzle[1] == MSL_COMPONENT_SWIZZLE_ZERO || swizzle[1] == MSL_COMPONENT_SWIZZLE_ONE ||
		        swizzle[2] == MSL_COMPONENT_SWIZZLE_ZERO || swizzle[2] == MSL_COMPONENT_SWIZZLE_ONE ||
		        swizzle[3] == MSL_COMPONENT_SWIZZLE_ZERO || swizzle[3] == MSL_COMPONENT_SWIZZLE_ONE);
	}